

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3ExprCodeGetColumnOfTable(Vdbe *v,Table *pTab,int iTabCur,int iCol,int regOut)

{
  i16 iVar1;
  int op_00;
  Index *pIdx;
  int local_2c;
  int x;
  int op;
  int regOut_local;
  int iCol_local;
  int iTabCur_local;
  Table *pTab_local;
  Vdbe *v_local;
  
  if (pTab == (Table *)0x0) {
    sqlite3VdbeAddOp3(v,0x60,iTabCur,iCol,regOut);
  }
  else {
    if ((iCol < 0) || (iCol == pTab->iPKey)) {
      sqlite3VdbeAddOp2(v,0x7b,iTabCur,regOut);
    }
    else {
      op_00 = 0x60;
      if (pTab->nModuleArg != 0) {
        op_00 = 0x9d;
      }
      local_2c = iCol;
      if (((pTab->tabFlags & 0x20) != 0) && (pTab->nModuleArg == 0)) {
        pIdx = sqlite3PrimaryKeyIndex(pTab);
        iVar1 = sqlite3ColumnOfIndex(pIdx,(i16)iCol);
        local_2c = (int)iVar1;
      }
      sqlite3VdbeAddOp3(v,op_00,iTabCur,local_2c,regOut);
    }
    if (-1 < iCol) {
      sqlite3ColumnDefault(v,pTab,iCol,regOut);
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3ExprCodeGetColumnOfTable(
  Vdbe *v,        /* The VDBE under construction */
  Table *pTab,    /* The table containing the value */
  int iTabCur,    /* The table cursor.  Or the PK cursor for WITHOUT ROWID */
  int iCol,       /* Index of the column to extract */
  int regOut      /* Extract the value into this register */
){
  if( pTab==0 ){
    sqlite3VdbeAddOp3(v, OP_Column, iTabCur, iCol, regOut);
    return;
  }
  if( iCol<0 || iCol==pTab->iPKey ){
    sqlite3VdbeAddOp2(v, OP_Rowid, iTabCur, regOut);
  }else{
    int op = IsVirtual(pTab) ? OP_VColumn : OP_Column;
    int x = iCol;
    if( !HasRowid(pTab) && !IsVirtual(pTab) ){
      x = sqlite3ColumnOfIndex(sqlite3PrimaryKeyIndex(pTab), iCol);
    }
    sqlite3VdbeAddOp3(v, op, iTabCur, x, regOut);
  }
  if( iCol>=0 ){
    sqlite3ColumnDefault(v, pTab, iCol, regOut);
  }
}